

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseDecisionDag.cpp
# Opt level: O2

void __thiscall
slang::analysis::CaseDecisionDag::CaseDecisionDag
          (CaseDecisionDag *this,span<const_slang::SVInt,_18446744073709551615UL> clauses,
          uint32_t bitWidth,bool wildcardX,uint32_t maxSteps)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  size_t sVar3;
  group_type_pointer pgVar4;
  value_type_pointer puVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  SVInt curPath;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  flat_hash_set<MemoKey> *pfVar13;
  ulong uVar14;
  value_type_conflict3 *elements_2;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  size_t i;
  ulong uVar18;
  uchar uVar19;
  uchar uVar21;
  uchar uVar22;
  byte bVar23;
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *activeIndicesInput;
  value_type_pointer local_f0;
  ClauseIndex index;
  flat_hash_set<MemoKey> *local_e0;
  flat_hash_set<ClauseIndex> *local_d8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_d0;
  group_type_pointer *local_c8;
  SVInt start;
  vector<unsigned_int,_std::allocator<unsigned_int>_> activeIndices;
  SVInt local_98;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  boost::unordered::
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_flat_set(&this->unreachableClauses);
  local_d0 = (table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&this->overlappingClauses;
  boost::unordered::
  unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::unordered_flat_set
            ((unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_d0);
  (this->counterexample).super__Optional_base<slang::SVInt,_false,_false>._M_payload.
  super__Optional_payload<slang::SVInt,_true,_false,_false>.
  super__Optional_payload_base<slang::SVInt>._M_engaged = false;
  this->gaveUp = false;
  this->steps = 0;
  local_e0 = &this->visitedKeys;
  boost::unordered::
  unordered_flat_set<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_flat_set(local_e0);
  local_d8 = &this->usedIndices;
  boost::unordered::
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_flat_set(local_d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&activeIndices,clauses._M_extent._M_extent_value._M_extent_value,
             (allocator_type *)&local_48);
  uVar10 = 0;
  for (; activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
         activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
      activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    *activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar10;
    uVar10 = uVar10 + 1;
  }
  SVInt::SVInt(&start,bitWidth,0,false);
  activeIndicesInput = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3fbba7;
  SVInt::SVInt(&local_98,&start.super_SVIntStorage);
  curPath.super_SVIntStorage._8_8_ = &activeIndices;
  curPath.super_SVIntStorage.field_0.pVal = (uint64_t *)&local_98;
  build(this,0,clauses,bitWidth,wildcardX,maxSteps,curPath,activeIndicesInput);
  SVInt::~SVInt(&local_98);
  if (this->steps < maxSteps) {
    for (uVar18 = 0; uVar18 != clauses._M_extent._M_extent_value._M_extent_value;
        uVar18 = uVar18 + 1) {
      index = (ClauseIndex)uVar18;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar18 & 0xffffffff;
      uVar14 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar11 = uVar14 >> ((byte)(this->usedIndices).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                .arrays.groups_size_index & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar14 & 0xff];
      uVar8 = (this->usedIndices).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              .arrays.groups_size_mask;
      uVar15 = 0;
      do {
        pgVar4 = (this->usedIndices).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 .arrays.groups_ + uVar11;
        local_58 = pgVar4->m[0].n;
        uStack_57 = pgVar4->m[1].n;
        uStack_56 = pgVar4->m[2].n;
        bStack_55 = pgVar4->m[3].n;
        uStack_54 = pgVar4->m[4].n;
        uStack_53 = pgVar4->m[5].n;
        uStack_52 = pgVar4->m[6].n;
        bStack_51 = pgVar4->m[7].n;
        uStack_50 = pgVar4->m[8].n;
        uStack_4f = pgVar4->m[9].n;
        uStack_4e = pgVar4->m[10].n;
        bStack_4d = pgVar4->m[0xb].n;
        uStack_4c = pgVar4->m[0xc].n;
        uStack_4b = pgVar4->m[0xd].n;
        uStack_4a = pgVar4->m[0xe].n;
        bStack_49 = pgVar4->m[0xf].n;
        uVar19 = (uchar)uVar2;
        auVar24[0] = -(local_58 == uVar19);
        uVar21 = (uchar)((uint)uVar2 >> 8);
        auVar24[1] = -(uStack_57 == uVar21);
        uVar22 = (uchar)((uint)uVar2 >> 0x10);
        auVar24[2] = -(uStack_56 == uVar22);
        bVar9 = (byte)((uint)uVar2 >> 0x18);
        auVar24[3] = -(bStack_55 == bVar9);
        auVar24[4] = -(uStack_54 == uVar19);
        auVar24[5] = -(uStack_53 == uVar21);
        auVar24[6] = -(uStack_52 == uVar22);
        auVar24[7] = -(bStack_51 == bVar9);
        auVar24[8] = -(uStack_50 == uVar19);
        auVar24[9] = -(uStack_4f == uVar21);
        auVar24[10] = -(uStack_4e == uVar22);
        auVar24[0xb] = -(bStack_4d == bVar9);
        auVar24[0xc] = -(uStack_4c == uVar19);
        auVar24[0xd] = -(uStack_4b == uVar21);
        auVar24[0xe] = -(uStack_4a == uVar22);
        auVar24[0xf] = -(bStack_49 == bVar9);
        for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
            uVar10 = uVar10 - 1 & uVar10) {
          uVar17 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          if ((this->usedIndices).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              .arrays.elements_[uVar11 * 0xf + (ulong)uVar17] == index) goto LAB_003fbd65;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_49) == 0)
        break;
        lVar12 = uVar11 + uVar15;
        uVar15 = uVar15 + 1;
        uVar11 = lVar12 + 1U & uVar8;
      } while (uVar15 <= uVar8);
      uVar15 = uVar14 >> ((byte)(this->unreachableClauses).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                .arrays.groups_size_index & 0x3f);
      uVar8 = (this->unreachableClauses).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              .arrays.groups_size_mask;
      uVar16 = 0;
      uVar11 = uVar15;
      do {
        pgVar4 = (this->unreachableClauses).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 .arrays.groups_ + uVar11;
        local_68 = pgVar4->m[0].n;
        uStack_67 = pgVar4->m[1].n;
        uStack_66 = pgVar4->m[2].n;
        bStack_65 = pgVar4->m[3].n;
        uStack_64 = pgVar4->m[4].n;
        uStack_63 = pgVar4->m[5].n;
        uStack_62 = pgVar4->m[6].n;
        bStack_61 = pgVar4->m[7].n;
        uStack_60 = pgVar4->m[8].n;
        uStack_5f = pgVar4->m[9].n;
        uStack_5e = pgVar4->m[10].n;
        bStack_5d = pgVar4->m[0xb].n;
        uStack_5c = pgVar4->m[0xc].n;
        uStack_5b = pgVar4->m[0xd].n;
        uStack_5a = pgVar4->m[0xe].n;
        bStack_59 = pgVar4->m[0xf].n;
        auVar25[0] = -(local_68 == uVar19);
        auVar25[1] = -(uStack_67 == uVar21);
        auVar25[2] = -(uStack_66 == uVar22);
        auVar25[3] = -(bStack_65 == bVar9);
        auVar25[4] = -(uStack_64 == uVar19);
        auVar25[5] = -(uStack_63 == uVar21);
        auVar25[6] = -(uStack_62 == uVar22);
        auVar25[7] = -(bStack_61 == bVar9);
        auVar25[8] = -(uStack_60 == uVar19);
        auVar25[9] = -(uStack_5f == uVar21);
        auVar25[10] = -(uStack_5e == uVar22);
        auVar25[0xb] = -(bStack_5d == bVar9);
        auVar25[0xc] = -(uStack_5c == uVar19);
        auVar25[0xd] = -(uStack_5b == uVar21);
        auVar25[0xe] = -(uStack_5a == uVar22);
        auVar25[0xf] = -(bStack_59 == bVar9);
        for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
            uVar10 = uVar10 - 1 & uVar10) {
          uVar17 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          if ((this->unreachableClauses).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              .arrays.elements_[uVar11 * 0xf + (ulong)uVar17] == index) goto LAB_003fbd65;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_59) == 0)
        break;
        lVar12 = uVar11 + uVar16;
        uVar16 = uVar16 + 1;
        uVar11 = lVar12 + 1U & uVar8;
      } while (uVar16 <= uVar8);
      if ((this->unreachableClauses).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          .size_ctrl.size <
          (this->unreachableClauses).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
        ::unchecked_emplace_at<unsigned_int_const&>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                    *)this,uVar15,uVar14,&index);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
        ::unchecked_emplace_with_rehash<unsigned_int_const&>
                  (&local_48,
                   (table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
                    *)this,uVar14,&index);
      }
LAB_003fbd65:
    }
    local_f0 = (this->overlappingClauses).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               .arrays.elements_;
    if (local_f0 != (value_type_pointer)0x0) {
      sVar3 = (this->overlappingClauses).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              .arrays.groups_size_mask;
      pfVar13 = (flat_hash_set<MemoKey> *)
                (this->overlappingClauses).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                .arrays.groups_;
      local_c8 = (group_type_pointer *)
                 (&(pfVar13->table_).
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                   .arrays.groups_size_index + sVar3 * 2);
      local_d8 = (flat_hash_set<ClauseIndex> *)
                 (&(pfVar13->table_).
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                   .arrays.groups_ + sVar3 * 2);
      while (pfVar13 != (flat_hash_set<MemoKey> *)local_d8) {
        auVar20[0] = -(*(char *)&(pfVar13->table_).
                                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                 .arrays.groups_size_index == '\0');
        auVar20[1] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_index + 1) == '\0');
        auVar20[2] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_index + 2) == '\0');
        auVar20[3] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_index + 3) == '\0');
        auVar20[4] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_index + 4) == '\0');
        auVar20[5] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_index + 5) == '\0');
        auVar20[6] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_index + 6) == '\0');
        auVar20[7] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_index + 7) == '\0');
        auVar20[8] = -(*(char *)&(pfVar13->table_).
                                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                 .arrays.groups_size_mask == '\0');
        auVar20[9] = -(*(char *)((long)&(pfVar13->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                        .arrays.groups_size_mask + 1) == '\0');
        auVar20[10] = -(*(char *)((long)&(pfVar13->table_).
                                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                         .arrays.groups_size_mask + 2) == '\0');
        auVar20[0xb] = -(*(char *)((long)&(pfVar13->table_).
                                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                          .arrays.groups_size_mask + 3) == '\0');
        auVar20[0xc] = -(*(char *)((long)&(pfVar13->table_).
                                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                          .arrays.groups_size_mask + 4) == '\0');
        auVar20[0xd] = -(*(char *)((long)&(pfVar13->table_).
                                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                          .arrays.groups_size_mask + 5) == '\0');
        auVar20[0xe] = -(*(char *)((long)&(pfVar13->table_).
                                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                          .arrays.groups_size_mask + 6) == '\0');
        auVar20[0xf] = -(*(char *)((long)&(pfVar13->table_).
                                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                          .arrays.groups_size_mask + 7) == '\0');
        uVar10 = ((uint)((flat_hash_set<MemoKey> *)local_c8 != pfVar13) << 0xe | 0x3fff) &
                 ~(uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar20[0xf] >> 7) << 0xf);
        local_e0 = pfVar13;
LAB_003fbdfe:
        if (uVar10 != 0) {
          uVar17 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar14 = (ulong)uVar17;
          auVar7 = ZEXT416(local_f0[uVar14].first) * ZEXT816(0x9e3779b97f4a7c15);
          uVar11 = auVar7._8_8_ ^ auVar7._0_8_;
          bVar9 = (byte)(this->unreachableClauses).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        .arrays.groups_size_index;
          uVar8 = uVar11 >> (bVar9 & 0x3f);
          uVar18 = (this->unreachableClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.groups_size_mask;
          pgVar4 = (this->unreachableClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.groups_;
          uVar2 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar11 & 0xff];
          puVar5 = (this->unreachableClauses).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   .arrays.elements_;
          uVar15 = 0;
          do {
            pgVar1 = pgVar4 + uVar8;
            local_78 = pgVar1->m[0].n;
            uStack_77 = pgVar1->m[1].n;
            uStack_76 = pgVar1->m[2].n;
            bStack_75 = pgVar1->m[3].n;
            uStack_74 = pgVar1->m[4].n;
            uStack_73 = pgVar1->m[5].n;
            uStack_72 = pgVar1->m[6].n;
            bStack_71 = pgVar1->m[7].n;
            uStack_70 = pgVar1->m[8].n;
            uStack_6f = pgVar1->m[9].n;
            uStack_6e = pgVar1->m[10].n;
            bStack_6d = pgVar1->m[0xb].n;
            uStack_6c = pgVar1->m[0xc].n;
            uStack_6b = pgVar1->m[0xd].n;
            uStack_6a = pgVar1->m[0xe].n;
            bStack_69 = pgVar1->m[0xf].n;
            uVar19 = (uchar)uVar2;
            auVar26[0] = -(local_78 == uVar19);
            uVar21 = (uchar)((uint)uVar2 >> 8);
            auVar26[1] = -(uStack_77 == uVar21);
            uVar22 = (uchar)((uint)uVar2 >> 0x10);
            auVar26[2] = -(uStack_76 == uVar22);
            bVar23 = (byte)((uint)uVar2 >> 0x18);
            auVar26[3] = -(bStack_75 == bVar23);
            auVar26[4] = -(uStack_74 == uVar19);
            auVar26[5] = -(uStack_73 == uVar21);
            auVar26[6] = -(uStack_72 == uVar22);
            auVar26[7] = -(bStack_71 == bVar23);
            auVar26[8] = -(uStack_70 == uVar19);
            auVar26[9] = -(uStack_6f == uVar21);
            auVar26[10] = -(uStack_6e == uVar22);
            auVar26[0xb] = -(bStack_6d == bVar23);
            auVar26[0xc] = -(uStack_6c == uVar19);
            auVar26[0xd] = -(uStack_6b == uVar21);
            auVar26[0xe] = -(uStack_6a == uVar22);
            auVar26[0xf] = -(bStack_69 == bVar23);
            for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe); uVar17 != 0
                ; uVar17 = uVar17 - 1 & uVar17) {
              uVar6 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              if (local_f0[uVar14].first == puVar5[uVar8 * 0xf + (ulong)uVar6]) goto LAB_003fbf79;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & bStack_69) == 0)
            break;
            lVar12 = uVar8 + uVar15;
            uVar15 = uVar15 + 1;
            uVar8 = lVar12 + 1U & uVar18;
          } while (uVar15 <= uVar18);
          auVar7 = ZEXT416(local_f0[uVar14].second) * ZEXT816(0x9e3779b97f4a7c15);
          uVar15 = auVar7._8_8_ ^ auVar7._0_8_;
          uVar8 = uVar15 >> (bVar9 & 0x3f);
          uVar2 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar15 & 0xff];
          uVar11 = 0;
          do {
            pgVar1 = pgVar4 + uVar8;
            local_88 = pgVar1->m[0].n;
            uStack_87 = pgVar1->m[1].n;
            uStack_86 = pgVar1->m[2].n;
            bStack_85 = pgVar1->m[3].n;
            uStack_84 = pgVar1->m[4].n;
            uStack_83 = pgVar1->m[5].n;
            uStack_82 = pgVar1->m[6].n;
            bStack_81 = pgVar1->m[7].n;
            uStack_80 = pgVar1->m[8].n;
            uStack_7f = pgVar1->m[9].n;
            uStack_7e = pgVar1->m[10].n;
            bStack_7d = pgVar1->m[0xb].n;
            uStack_7c = pgVar1->m[0xc].n;
            uStack_7b = pgVar1->m[0xd].n;
            uStack_7a = pgVar1->m[0xe].n;
            bStack_79 = pgVar1->m[0xf].n;
            uVar19 = (uchar)uVar2;
            auVar27[0] = -(local_88 == uVar19);
            uVar21 = (uchar)((uint)uVar2 >> 8);
            auVar27[1] = -(uStack_87 == uVar21);
            uVar22 = (uchar)((uint)uVar2 >> 0x10);
            auVar27[2] = -(uStack_86 == uVar22);
            bVar9 = (byte)((uint)uVar2 >> 0x18);
            auVar27[3] = -(bStack_85 == bVar9);
            auVar27[4] = -(uStack_84 == uVar19);
            auVar27[5] = -(uStack_83 == uVar21);
            auVar27[6] = -(uStack_82 == uVar22);
            auVar27[7] = -(bStack_81 == bVar9);
            auVar27[8] = -(uStack_80 == uVar19);
            auVar27[9] = -(uStack_7f == uVar21);
            auVar27[10] = -(uStack_7e == uVar22);
            auVar27[0xb] = -(bStack_7d == bVar9);
            auVar27[0xc] = -(uStack_7c == uVar19);
            auVar27[0xd] = -(uStack_7b == uVar21);
            auVar27[0xe] = -(uStack_7a == uVar22);
            auVar27[0xf] = -(bStack_79 == bVar9);
            for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe); uVar17 != 0
                ; uVar17 = uVar17 - 1 & uVar17) {
              uVar6 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              if (local_f0[uVar14].second == puVar5[uVar8 * 0xf + (ulong)uVar6]) goto LAB_003fbf79;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bStack_79) == 0)
            break;
            lVar12 = uVar8 + uVar11;
            uVar11 = uVar11 + 1;
            uVar8 = lVar12 + 1U & uVar18;
          } while (uVar11 <= uVar18);
          goto LAB_003fbf88;
        }
        local_f0 = local_f0 + 0xf;
        pfVar13 = (flat_hash_set<MemoKey> *)
                  &(local_e0->table_).
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                   .arrays.groups_;
      }
    }
  }
  else {
    this->gaveUp = true;
  }
  SVInt::~SVInt(&start);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&activeIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
LAB_003fbf79:
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::recover_slot(local_d0,(uchar *)((long)&(local_e0->table_).
                                           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int>_>_>_>
                                           .arrays.groups_size_index + uVar14));
LAB_003fbf88:
  uVar10 = uVar10 - 1 & uVar10;
  goto LAB_003fbdfe;
}

Assistant:

CaseDecisionDag::CaseDecisionDag(std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
                                 uint32_t maxSteps) {
    SLANG_ASSERT(bitWidth > 0);

    std::vector<ClauseIndex> activeIndices(clauses.size());
    std::iota(activeIndices.begin(), activeIndices.end(), 0);

#if defined(SLANG_DEBUG)
    for (auto& clause : clauses)
        SLANG_ASSERT(clause.getBitWidth() == bitWidth);
#endif

    SVInt start(bitWidth, 0, false);
    build(0, clauses, bitWidth, wildcardX, maxSteps, start, std::move(activeIndices));

    if (steps >= maxSteps) {
        gaveUp = true;
        return;
    }

    // Any clauses not used are marked as redundant.
    for (size_t i = 0; i < clauses.size(); i++) {
        auto index = (ClauseIndex)i;
        if (usedIndices.find(index) == usedIndices.end())
            unreachableClauses.insert(index);
    }

    // Remove overlapping clauses that are fully unreachable.
    erase_if(overlappingClauses, [&](const auto& pair) {
        return unreachableClauses.contains(pair.first) || unreachableClauses.contains(pair.second);
    });
}